

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

bool find_boost_root(void)

{
  bool bVar1;
  path local_a8;
  uint local_84;
  path local_80;
  undefined1 local_60 [8];
  path p;
  path local_30;
  int local_10;
  byte local_9;
  int i;
  
  local_10 = 0;
  do {
    if (0x1f < local_10) {
      local_9 = 0;
LAB_0010af5e:
      return (bool)(local_9 & 1);
    }
    boost::filesystem::path::path(&local_30,"Jamroot");
    bVar1 = boost::filesystem::exists(&local_30);
    boost::filesystem::path::~path(&local_30);
    if (bVar1) {
      local_9 = 1;
      goto LAB_0010af5e;
    }
    boost::filesystem::current_path();
    boost::filesystem::path::root_path();
    bVar1 = boost::filesystem::operator==((path *)local_60,&local_80);
    boost::filesystem::path::~path(&local_80);
    if (bVar1) {
      local_9 = 0;
    }
    else {
      boost::filesystem::path::parent_path();
      boost::filesystem::current_path(&local_a8);
      boost::filesystem::path::~path(&local_a8);
    }
    local_84 = (uint)bVar1;
    boost::filesystem::path::~path((path *)local_60);
    if (local_84 != 0) goto LAB_0010af5e;
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

static bool find_boost_root()
{
    for( int i = 0; i < 32; ++i )
    {
        if( fs::exists( "Jamroot" ) )
        {
            return true;
        }

        fs::path p = fs::current_path();

        if( p == p.root_path() )
        {
            return false;
        }

        fs::current_path( p.parent_path() );
    }

    return false;
}